

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyHashingShardedKVS.hpp
# Opt level: O0

void __thiscall
supermap::KeyHashingShardedKVS<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::
add(KeyHashingShardedKVS<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this,
   Key<128UL> *key,ByteArray<4096UL> *value)

{
  size_t __n;
  pointer pKVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  Key<128UL> *in_stack_000000e8;
  KeyHashingShardedKVS<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>
  *in_stack_000000f0;
  
  __n = getShardIdForKey(in_stack_000000f0,in_stack_000000e8);
  std::
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
  ::operator[]((vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
                *)(in_RDI + 8),__n);
  pKVar1 = std::
           unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
           ::operator->((unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
                         *)0x2a3323);
  (**pKVar1->_vptr_KeyValueStorage)(pKVar1,in_RSI,in_RDX);
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        nestedStorages_[getShardIdForKey(key)]->add(key, std::move(value));
    }